

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

inform_dist * inform_dist_create(uint32_t *data,size_t n)

{
  inform_dist *__ptr;
  uint32_t *__dest;
  uint64_t uVar1;
  size_t i;
  size_t sVar2;
  
  if ((n != 0 && data != (uint32_t *)0x0) &&
     (__ptr = (inform_dist *)malloc(0x18), __ptr != (inform_dist *)0x0)) {
    __dest = (uint32_t *)calloc(n,4);
    __ptr->histogram = __dest;
    if (__dest != (uint32_t *)0x0) {
      memcpy(__dest,data,n * 4);
      __ptr->size = n;
      uVar1 = 0;
      sVar2 = 0;
      do {
        uVar1 = uVar1 + __dest[sVar2];
        sVar2 = sVar2 + 1;
      } while (n != sVar2);
      __ptr->counts = uVar1;
      return __ptr;
    }
    free(__ptr);
  }
  return (inform_dist *)0x0;
}

Assistant:

inform_dist* inform_dist_create(uint32_t const *data, size_t n)
{
    // if the requested support size is zero, return NULL
    if (data == NULL || n == 0)
    {
        return NULL;
    }
    // allocate the distribution
    inform_dist *dist = malloc(sizeof(inform_dist));
    // if the allocation succeeded
    if (dist != NULL)
    {
        // allocate the underlying histogram
        dist->histogram = calloc(n, sizeof(uint32_t));
        // if the allocation succeeded
        if (dist->histogram != NULL)
        {
            // set the distribution content, size and counts
            memcpy(dist->histogram, data, n*sizeof(uint32_t));
            dist->size   = n;
            dist->counts = 0;
            for (size_t i = 0; i < n; ++i)
            {
                dist->counts += dist->histogram[i];
            }
        }
        // otherwise free the distribution
        else
        {
            free(dist);
            dist = NULL;
        }
    }
    // return the (potentially NULL) distribution
    return dist;
}